

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qheaderview.cpp
# Opt level: O1

ssize_t __thiscall
QHeaderViewPrivate::read(QHeaderViewPrivate *this,int __fd,void *__buf,size_t __nbytes)

{
  QList<int> *this_00;
  QList<int> *this_01;
  QList<QHeaderViewPrivate::SectionItem> *this_02;
  long lVar1;
  SectionItem *pSVar2;
  QAbstractItemModel *pQVar3;
  qsizetype i_00;
  HeaderMode HVar4;
  pointer pSVar5;
  uint uVar6;
  long lVar7;
  ulong uVar8;
  QModelIndex *__return_storage_ptr__;
  int i;
  uint uVar9;
  int iVar10;
  undefined4 in_register_00000034;
  QDataStream *this_03;
  long lVar11;
  undefined7 uVar12;
  long in_FS_OFFSET;
  bool bVar13;
  SectionItem section;
  int iHeaderMode;
  int inSortIndicatorClearable;
  int inLastSectionSize;
  bool tmpbool;
  int tmpint;
  int unusedSectionCount;
  int minimumSectionSizeIn;
  int defaultSectionSizeIn;
  int contentsSectionsIn;
  int stretchSectionsIn;
  bool cascadingResizingIn;
  bool stretchLastSectionIn;
  bool highlightSelectedIn;
  bool clickableSectionsIn;
  bool movableSectionsIn;
  int lengthIn;
  bool sortIndicatorShownIn;
  int sortIndicatorSectionIn;
  int global;
  int align;
  int order;
  int orient;
  QModelIndex local_160;
  QModelIndex local_148;
  HeaderMode local_12c;
  int local_128;
  int local_124;
  bool local_11d;
  int local_11c;
  QArrayDataPointer<QHeaderViewPrivate::SectionItem> local_118;
  int local_fc;
  QBitArray local_f8;
  QList<QHeaderViewPrivate::SectionItem> local_d8;
  int local_b8;
  uint local_b4;
  int local_b0;
  int local_ac;
  bool local_a5;
  bool local_a4;
  bool local_a3;
  bool local_a2;
  bool local_a1;
  QHash<int,_int> local_a0;
  QArrayDataPointer<int> local_98;
  QArrayDataPointer<int> local_78;
  int local_54;
  bool local_4d;
  int local_4c;
  ResizeMode local_48;
  QFlagsStorage<Qt::AlignmentFlag> local_44;
  SortOrder local_40;
  Orientation local_3c;
  long local_38;
  
  this_03 = (QDataStream *)CONCAT44(in_register_00000034,__fd);
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = *(long *)&(this->super_QAbstractItemViewPrivate).super_QAbstractScrollAreaPrivate.
                    super_QFramePrivate.super_QWidgetPrivate.field_0x8;
  local_3c = 0xaaaaaaaa;
  local_40 = 0xaaaaaaaa;
  local_44.i = 0xaaaaaaaa;
  local_48 = 0xaaaaaaaa;
  local_4c = -0x55555556;
  local_4d = true;
  local_54 = -0x55555556;
  local_78.d = (Data *)0x0;
  local_78.ptr = (int *)0x0;
  local_78.size = 0;
  local_98.d = (Data *)0x0;
  local_98.ptr = (int *)0x0;
  local_98.size = 0;
  local_a0.d = (Data *)0x0;
  local_a1 = true;
  local_a2 = true;
  local_a3 = true;
  local_a4 = true;
  local_a5 = true;
  local_ac = -0x55555556;
  local_b0 = -0x55555556;
  local_b4 = 0xaaaaaaaa;
  local_b8 = -0x55555556;
  local_d8.d.d = (Data *)0x0;
  local_d8.d.ptr = (SectionItem *)0x0;
  local_d8.d.size = 0;
  QDataStream::operator>>(this_03,(int *)&local_3c);
  QDataStream::operator>>(this_03,(int *)&local_40);
  QDataStream::operator>>(this_03,&local_4c);
  QDataStream::operator>>(this_03,&local_4d);
  QtPrivate::readArrayBasedContainer<QList<int>>(this_03,(QList<int> *)&local_78);
  QtPrivate::readArrayBasedContainer<QList<int>>(this_03,(QList<int> *)&local_98);
  local_f8.d.d.d = (Data *)0x0;
  local_f8.d.d.ptr = (char *)0x0;
  local_f8.d.d.size = 0;
  ::operator>>(this_03,&local_f8);
  QtPrivate::readAssociativeContainer<QHash<int,int>>(this_03,&local_a0);
  QDataStream::operator>>(this_03,&local_54);
  local_fc = -0x55555556;
  QDataStream::operator>>(this_03,&local_fc);
  uVar8 = 0;
  if ((this_03[0x13] != (QDataStream)0x0) || (local_54 < 0)) goto LAB_00556f1a;
  QDataStream::operator>>(this_03,&local_a1);
  QDataStream::operator>>(this_03,&local_a2);
  QDataStream::operator>>(this_03,&local_a3);
  QDataStream::operator>>(this_03,&local_a4);
  QDataStream::operator>>(this_03,&local_a5);
  QDataStream::operator>>(this_03,&local_ac);
  QDataStream::operator>>(this_03,&local_b0);
  QDataStream::operator>>(this_03,(int *)&local_b4);
  QDataStream::operator>>(this_03,&local_b8);
  QDataStream::operator>>(this_03,(int *)&local_44);
  QDataStream::operator>>(this_03,(int *)&local_48);
  uVar8 = 0;
  if ((ResizeToContents < local_48) || (uVar8 = 0, 0x1e0 < local_44.i)) goto LAB_00556f1a;
  QtPrivate::readArrayBasedContainer<QList<QHeaderViewPrivate::SectionItem>>(this_03,&local_d8);
  local_118.d = (Data *)0x0;
  local_118.ptr = (SectionItem *)0x0;
  local_118.size = 0;
  if (local_d8.d.size != 0) {
    uVar8 = 0;
    do {
      uVar9 = local_d8.d.ptr[uVar8].field_4.calculated_startpos;
      if (1 < (int)uVar9) {
        pSVar5 = QList<QHeaderViewPrivate::SectionItem>::data(&local_d8);
        *(uint *)(pSVar5 + uVar8) =
             *(uint *)(pSVar5 + uVar8) & 0xfff00000 | (*(uint *)(pSVar5 + uVar8) & 0xfffff) / uVar9;
      }
      if (0 < (int)uVar9) {
        do {
          pSVar5 = QList<QHeaderViewPrivate::SectionItem>::data(&local_d8);
          QtPrivate::QPodArrayOps<QHeaderViewPrivate::SectionItem>::
          emplace<QHeaderViewPrivate::SectionItem_const&>
                    ((QPodArrayOps<QHeaderViewPrivate::SectionItem> *)&local_118,local_118.size,
                     pSVar5 + uVar8);
          QList<QHeaderViewPrivate::SectionItem>::end
                    ((QList<QHeaderViewPrivate::SectionItem> *)&local_118);
          uVar9 = uVar9 - 1;
        } while (uVar9 != 0);
      }
      uVar8 = uVar8 + 1;
    } while (uVar8 < (ulong)local_d8.d.size);
  }
  if (local_118.size == 0) {
    iVar10 = 0;
  }
  else {
    lVar11 = 0;
    iVar10 = 0;
    do {
      iVar10 = iVar10 + (*(uint *)(&(local_118.ptr)->field_0x0 + lVar11) & 0xfffff);
      lVar11 = lVar11 + 8;
    } while (local_118.size * 8 - lVar11 != 0);
  }
  if ((iVar10 == local_54) || (local_118.size == 0)) {
    this->headerMode = FlexibleWithSectionMemoryUsage;
    this->orientation = local_3c;
    this->sortIndicatorOrder = local_40;
    this->sortIndicatorSection = local_4c;
    this->sortIndicatorShown = local_4d;
    this_00 = &this->visualIndices;
    QArrayDataPointer<int>::operator=(&this_00->d,&local_78);
    this_01 = &this->logicalIndices;
    QArrayDataPointer<int>::operator=(&this_01->d,&local_98);
    QHash<int,_int>::operator=(&this->hiddenSectionSize,&local_a0);
    this->length = local_54;
    this->movableSections = local_a1;
    this->clickableSections = local_a2;
    this->highlightSelected = local_a3;
    this->stretchLastSection = local_a4;
    this->cascadingResizing = local_a5;
    this->stretchSections = local_ac;
    this->contentsSections = local_b0;
    this->defaultSectionSize = local_b4;
    this->minimumSectionSize = local_b8;
    (this->defaultAlignment).super_QFlagsStorageHelper<Qt::AlignmentFlag,_4>.
    super_QFlagsStorage<Qt::AlignmentFlag>.i = local_44.i;
    this->globalResizeMode = local_48;
    this_02 = &this->sectionItems;
    QArrayDataPointer<QHeaderViewPrivate::SectionItem>::operator=(&this_02->d,&local_118);
    setHiddenSectionsFromBitVector(this,&local_f8);
    lVar11 = (this->sectionItems).d.size;
    if (lVar11 != 0) {
      pSVar2 = (this->sectionItems).d.ptr;
      lVar7 = 0;
      iVar10 = 0;
      do {
        *(int *)((long)&pSVar2->field_4 + lVar7) = iVar10;
        iVar10 = iVar10 + (*(uint *)(&pSVar2->field_0x0 + lVar7) & 0xfffff);
        lVar7 = lVar7 + 8;
      } while (lVar11 << 3 != lVar7);
    }
    this->sectionStartposRecalc = false;
    local_11c = -0x55555556;
    QDataStream::operator>>(this_03,&local_11c);
    if (this_03[0x13] == (QDataStream)0x0) {
      this->resizeContentsPrecision = local_11c;
    }
    local_11d = true;
    QDataStream::operator>>(this_03,&local_11d);
    if ((this_03[0x13] == (QDataStream)0x0) &&
       (this->customDefaultSectionSize = local_11d, local_11d == false)) {
      updateDefaultSectionSizeFromStyle(this);
    }
    this->lastSectionSize = -1;
    local_124 = -0x55555556;
    QDataStream::operator>>(this_03,&local_124);
    if (this_03[0x13] == (QDataStream)0x0) {
      this->lastSectionSize = local_124;
    }
    this->lastSectionLogicalIdx = -1;
    if (this->stretchLastSection == true) {
      uVar9 = lastVisibleVisualIndex(this);
      if ((int)uVar9 < 0) {
        uVar6 = 0xffffffff;
      }
      else {
        lVar1 = *(long *)(lVar1 + 8);
        if (*(int *)(lVar1 + 0x650) == 0) {
          iVar10 = (int)*(undefined8 *)(lVar1 + 0x658);
        }
        else {
          iVar10 = (int)*(undefined8 *)(lVar1 + 0x648);
        }
        uVar6 = 0xffffffff;
        if ((int)uVar9 < iVar10) {
          uVar6 = uVar9;
        }
        if (((*(int *)(lVar1 + 0x650) != 0) && ((int)uVar9 < iVar10)) &&
           (uVar6 = uVar9, *(long *)(lVar1 + 0x580) != 0)) {
          uVar6 = *(uint *)(*(long *)(lVar1 + 0x578) + (ulong)uVar9 * 4);
        }
      }
      this->lastSectionLogicalIdx = uVar6;
      if ((this->delayedResize).m_id == Invalid) {
        QBasicTimer::start(&this->delayedResize,0,1,
                           *(undefined8 *)
                            &(this->super_QAbstractItemViewPrivate).super_QAbstractScrollAreaPrivate
                             .super_QFramePrivate.super_QWidgetPrivate.field_0x8);
      }
    }
    local_128 = -0x55555556;
    QDataStream::operator>>(this_03,&local_128);
    if (this_03[0x13] == (QDataStream)0x0) {
      this->sortIndicatorClearable = local_128 != 0;
    }
    QDataStream::operator>>(this_03,&this->countInNoSectionItemsMode);
    local_12c = 0xaaaaaaaa;
    QDataStream::operator>>(this_03,(int *)&local_12c);
    if (this_03[0x13] != (QDataStream)0x0) {
      local_12c = FlexibleWithSectionMemoryUsage;
    }
    HVar4 = local_12c;
    if (FlexibleWithSectionMemoryUsage < local_12c) {
      lVar1 = this->countInNoSectionItemsMode;
      if ((lVar1 < 1) || ((this->sectionItems).d.size != 0)) {
        if ((0 < lVar1) ||
           (HVar4 = FlexibleWithSectionMemoryUsage, (this->sectionItems).d.size == 0)) {
          this->headerMode = FlexibleWithSectionMemoryUsage;
          goto LAB_00556ebf;
        }
      }
      else {
        HVar4 = InitialNoSectionMemoryUsage;
      }
    }
    this->headerMode = HVar4;
    bVar13 = local_3c == Horizontal;
    __return_storage_ptr__ = &local_160;
    if (bVar13) {
      __return_storage_ptr__ = &local_148;
    }
    pQVar3 = (this->super_QAbstractItemViewPrivate).model;
    QPersistentModelIndex::operator_cast_to_QModelIndex
              (__return_storage_ptr__,&(this->super_QAbstractItemViewPrivate).root);
    uVar9 = (**(code **)(*(long *)pQVar3 + 0x78 + (ulong)bVar13 * 8))(pQVar3,__return_storage_ptr__)
    ;
    uVar8 = (this->sectionItems).d.size;
    uVar12 = (undefined7)((ulong)this_00 >> 8);
    if ((long)uVar8 < (long)(int)uVar9) {
      if (this->headerMode != InitialNoSectionMemoryUsage) {
        if (((local_78.size != 0) && (local_98.size != 0)) && ((int)uVar8 < (int)uVar9)) {
          do {
            iVar10 = (int)uVar8;
            local_148.r = iVar10;
            QtPrivate::QPodArrayOps<int>::emplace<int&>
                      ((QPodArrayOps<int> *)this_00,(this->visualIndices).d.size,&local_148.r);
            QList<int>::end(this_00);
            local_148.r = iVar10;
            QtPrivate::QPodArrayOps<int>::emplace<int&>
                      ((QPodArrayOps<int> *)this_01,(this->logicalIndices).d.size,&local_148.r);
            QList<int>::end(this_01);
            uVar8 = (ulong)(iVar10 + 1U);
          } while (uVar9 != iVar10 + 1U);
        }
        i_00 = (this->sectionItems).d.size;
        iVar10 = (int)i_00;
        local_54 = local_54 + (uVar9 - iVar10) * local_b4;
        local_148.c = -1;
        local_148.r = (local_b4 & 0xfffff) + (this->globalResizeMode & 0x1f) * 0x200000 +
                      -0x58000000;
        iVar10 = uVar9 - iVar10;
        uVar8 = CONCAT71(uVar12,1);
        if (iVar10 != 0) {
          QtPrivate::QPodArrayOps<QHeaderViewPrivate::SectionItem>::insert
                    ((QPodArrayOps<QHeaderViewPrivate::SectionItem> *)this_02,i_00,(long)iVar10,
                     (parameter_type)&local_148);
        }
        QList<QHeaderViewPrivate::SectionItem>::begin(this_02);
        goto LAB_00556ef7;
      }
      this->countInNoSectionItemsMode = (long)(int)uVar9;
      this->length = this->defaultSectionSize * uVar9;
    }
    uVar8 = CONCAT71(uVar12,1);
  }
  else {
LAB_00556ebf:
    uVar8 = 0;
  }
LAB_00556ef7:
  if (&(local_118.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_118.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_118.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_118.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_118.d)->super_QArrayData,8,0x10);
    }
  }
LAB_00556f1a:
  if (&(local_f8.d.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_f8.d.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_f8.d.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_f8.d.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_f8.d.d.d)->super_QArrayData,1,0x10);
    }
  }
  if (&(local_d8.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_d8.d.d)->super_QArrayData,8,0x10);
    }
  }
  QHash<int,_int>::~QHash(&local_a0);
  if (&(local_98.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_98.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_98.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_98.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_98.d)->super_QArrayData,4,0x10);
    }
  }
  if (&(local_78.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_78.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_78.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_78.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_78.d)->super_QArrayData,4,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return uVar8 & 0xffffffff;
}

Assistant:

bool QHeaderViewPrivate::read(QDataStream &in)
{
    Q_Q(QHeaderView);
    int orient, order, align, global;
    int sortIndicatorSectionIn;
    bool sortIndicatorShownIn;
    int lengthIn;
    QList<int> visualIndicesIn;
    QList<int> logicalIndicesIn;
    QHash<int, int> hiddenSectionSizeIn;
    bool movableSectionsIn;
    bool clickableSectionsIn;
    bool highlightSelectedIn;
    bool stretchLastSectionIn;
    bool cascadingResizingIn;
    int stretchSectionsIn;
    int contentsSectionsIn;
    int defaultSectionSizeIn;
    int minimumSectionSizeIn;
    QList<SectionItem> sectionItemsIn;

    in >> orient;
    in >> order;

    in >> sortIndicatorSectionIn;
    in >> sortIndicatorShownIn;

    in >> visualIndicesIn;
    in >> logicalIndicesIn;

    QBitArray sectionHidden;
    in >> sectionHidden;
    in >> hiddenSectionSizeIn;
    in >> lengthIn;

    int unusedSectionCount; // For compatibility
    in >> unusedSectionCount;

    if (in.status() != QDataStream::Ok || lengthIn < 0)
        return false;

    in >> movableSectionsIn;
    in >> clickableSectionsIn;
    in >> highlightSelectedIn;
    in >> stretchLastSectionIn;
    in >> cascadingResizingIn;
    in >> stretchSectionsIn;
    in >> contentsSectionsIn;
    in >> defaultSectionSizeIn;
    in >> minimumSectionSizeIn;

    in >> align;

    in >> global;

    // Check parameter consistency
    // Global orientation out of bounds?
    if (global < 0 || global > QHeaderView::ResizeToContents)
        return false;

    // Alignment out of bounds?
    if (align < 0 || align > Qt::AlignVertical_Mask)
        return false;

    in >> sectionItemsIn;


    // In Qt4 we had a vector of spans where one span could hold information on more sections.
    // Now we have an itemvector where one items contains information about one section
    // For backward compatibility with Qt4 we do the following
    QList<SectionItem> newSectionItems;
    for (int u = 0; u < sectionItemsIn.size(); ++u) {
        int count = sectionItemsIn.at(u).tmpDataStreamSectionCount;
        if (count > 1)
            sectionItemsIn[u].size /= count;
        for (int n = 0; n < count; ++n)
            newSectionItems.append(sectionItemsIn[u]);
    }

    int sectionItemsLengthTotal = 0;
    for (const SectionItem &section : std::as_const(newSectionItems))
        sectionItemsLengthTotal += section.size;

    if (sectionItemsLengthTotal != lengthIn && newSectionItems.size() > 0)
        return false;

    // We don't want to do an actual change in normal mode.
    // (Hence we have already set up sections etc)
    headerMode = HeaderMode::FlexibleWithSectionMemoryUsage;

    orientation = static_cast<Qt::Orientation>(orient);
    sortIndicatorOrder = static_cast<Qt::SortOrder>(order);
    sortIndicatorSection = sortIndicatorSectionIn;
    sortIndicatorShown = sortIndicatorShownIn;
    visualIndices = visualIndicesIn;
    logicalIndices = logicalIndicesIn;
    hiddenSectionSize = hiddenSectionSizeIn;
    length = lengthIn;

    movableSections = movableSectionsIn;
    clickableSections = clickableSectionsIn;
    highlightSelected = highlightSelectedIn;
    stretchLastSection = stretchLastSectionIn;
    cascadingResizing = cascadingResizingIn;
    stretchSections = stretchSectionsIn;
    contentsSections = contentsSectionsIn;
    defaultSectionSize = defaultSectionSizeIn;
    minimumSectionSize = minimumSectionSizeIn;

    defaultAlignment = Qt::Alignment(align);
    globalResizeMode = static_cast<QHeaderView::ResizeMode>(global);

    sectionItems = newSectionItems;
    setHiddenSectionsFromBitVector(sectionHidden);
    recalcSectionStartPos();

    int tmpint;
    in >> tmpint;
    if (in.status() == QDataStream::Ok)  // we haven't read past end
        resizeContentsPrecision = tmpint;

    bool tmpbool;
    in >> tmpbool;
    if (in.status() == QDataStream::Ok) {  // we haven't read past end
        customDefaultSectionSize = tmpbool;
        if (!customDefaultSectionSize)
            updateDefaultSectionSizeFromStyle();
    }

    lastSectionSize = -1;
    int inLastSectionSize;
    in >> inLastSectionSize;
    if (in.status() == QDataStream::Ok)
        lastSectionSize = inLastSectionSize;

    lastSectionLogicalIdx = -1;
    if (stretchLastSection) {
        lastSectionLogicalIdx = q->logicalIndex(lastVisibleVisualIndex());
        doDelayedResizeSections();
    }

    int inSortIndicatorClearable;
    in >> inSortIndicatorClearable;
    if (in.status() == QDataStream::Ok)  // we haven't read past end
        sortIndicatorClearable = inSortIndicatorClearable;

    in >> countInNoSectionItemsMode;
    int iHeaderMode;

    in >> iHeaderMode;
    // On any failure (especially reading past end) we consider mode to be normal by default.
    if (in.status() != QDataStream::Ok) {
        iHeaderMode = static_cast<int>(HeaderMode::FlexibleWithSectionMemoryUsage);
    }

    const HeaderMode impMode = static_cast<HeaderMode>(iHeaderMode);
    if (impMode == HeaderMode::FlexibleWithSectionMemoryUsage || impMode == HeaderMode::InitialNoSectionMemoryUsage) {
        headerMode = impMode;
    }
    else {
        // Then it must be from a newer version with a new enum value and we simply
        // take the best match.
        if (countInNoSectionItemsMode > 0 && sectionItems.isEmpty()) {
            headerMode = HeaderMode::InitialNoSectionMemoryUsage;
        }
        else if (countInNoSectionItemsMode <= 0 && !sectionItems.isEmpty()) {
            headerMode = HeaderMode::FlexibleWithSectionMemoryUsage;
        }
        else {
            // We shouldn't end up with both sections and a section count (countInNoSectionItemsMode) > 0.
            headerMode = HeaderMode::FlexibleWithSectionMemoryUsage;
            return false;
        }
    }

    // Append items from model.
    const int currentCount = (orient == Qt::Horizontal ? model->columnCount(root) : model->rowCount(root));
    if (sectionItems.size() < currentCount) {

        if (noSectionMemoryUsage()) {
            countInNoSectionItemsMode = currentCount;
            length = defaultSectionSize * countInNoSectionItemsMode;
        } else {
             // we have sections not in the saved state, give them default settings
            if (!visualIndicesIn.isEmpty() && !logicalIndicesIn.isEmpty()) {
                for (int i = sectionItems.size(); i < currentCount; ++i) {
                    visualIndices.append(i);
                    logicalIndices.append(i);
                }
            }
            const int insertCount = currentCount - sectionItems.size();
            const int insertLength = defaultSectionSizeIn * insertCount;
            lengthIn += insertLength;
            SectionItem section(defaultSectionSizeIn, globalResizeMode);
            sectionItems.insert(sectionItems.size(), insertCount, section); // append
        }
    }
    return true;
}